

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

int __thiscall Fl_X::set_cursor(Fl_X *this,Fl_RGB_Image *image,int hotx,int hoty)

{
  int iVar1;
  int iVar2;
  long lVar3;
  char **ppcVar4;
  undefined8 uVar5;
  int local_70;
  int local_58;
  int local_54;
  int x;
  int y;
  XcursorPixel *o;
  uchar *i;
  int extra_data;
  Cursor xc;
  XcursorImage *cursor;
  int hoty_local;
  int hotx_local;
  Fl_RGB_Image *image_local;
  Fl_X *this_local;
  
  if ((hotx < 0) || (iVar1 = Fl_Image::w(&image->super_Fl_Image), iVar1 <= hotx)) {
    this_local._4_4_ = 0;
  }
  else if ((hoty < 0) || (iVar1 = Fl_Image::h(&image->super_Fl_Image), iVar1 <= hoty)) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = Fl_Image::w(&image->super_Fl_Image);
    iVar2 = Fl_Image::h(&image->super_Fl_Image);
    lVar3 = XcursorImageCreate(iVar1,iVar2);
    if (lVar3 == 0) {
      this_local._4_4_ = 0;
    }
    else {
      iVar1 = Fl_Image::ld(&image->super_Fl_Image);
      if (iVar1 == 0) {
        local_70 = 0;
      }
      else {
        local_70 = Fl_Image::ld(&image->super_Fl_Image);
        iVar1 = Fl_Image::w(&image->super_Fl_Image);
        iVar2 = Fl_Image::d(&image->super_Fl_Image);
        local_70 = local_70 - iVar1 * iVar2;
      }
      ppcVar4 = Fl_Image::data(&image->super_Fl_Image);
      o = (XcursorPixel *)*ppcVar4;
      _x = *(uint **)(lVar3 + 0x20);
      for (local_54 = 0; iVar1 = Fl_Image::h(&image->super_Fl_Image), local_54 < iVar1;
          local_54 = local_54 + 1) {
        for (local_58 = 0; iVar1 = Fl_Image::w(&image->super_Fl_Image), local_58 < iVar1;
            local_58 = local_58 + 1) {
          iVar1 = Fl_Image::d(&image->super_Fl_Image);
          switch(iVar1) {
          case 1:
            *_x = (uint)(byte)*o << 0x10 | 0xff000000 | (uint)(byte)*o << 8 | (uint)(byte)*o;
            break;
          case 2:
            *_x = (uint)*(byte *)((long)o + 1) << 0x18 | (uint)(byte)*o << 0x10 |
                  (uint)(byte)*o << 8 | (uint)(byte)*o;
            break;
          case 3:
            *_x = (uint)(byte)*o << 0x10 | 0xff000000 | (uint)*(byte *)((long)o + 1) << 8 |
                  (uint)*(byte *)((long)o + 2);
            break;
          case 4:
            *_x = (uint)*(byte *)((long)o + 3) << 0x18 | (uint)(byte)*o << 0x10 |
                  (uint)*(byte *)((long)o + 1) << 8 | (uint)*(byte *)((long)o + 2);
          }
          iVar1 = Fl_Image::d(&image->super_Fl_Image);
          o = (XcursorPixel *)((long)o + (long)iVar1);
          _x = _x + 1;
        }
        o = (XcursorPixel *)((long)o + (long)local_70);
      }
      *(int *)(lVar3 + 0x10) = hotx;
      *(int *)(lVar3 + 0x14) = hoty;
      uVar5 = XcursorImageLoadCursor(fl_display,lVar3);
      XDefineCursor(fl_display,this->xid,uVar5);
      XFreeCursor(fl_display,uVar5);
      XcursorImageDestroy(lVar3);
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_X::set_cursor(const Fl_RGB_Image *image, int hotx, int hoty) {
#if ! HAVE_XCURSOR
  return 0;
#else
  XcursorImage *cursor;
  Cursor xc;

  if ((hotx < 0) || (hotx >= image->w()))
    return 0;
  if ((hoty < 0) || (hoty >= image->h()))
    return 0;

  cursor = XcursorImageCreate(image->w(), image->h());
  if (!cursor)
    return 0;

  const int extra_data = image->ld() ? (image->ld()-image->w()*image->d()) : 0;
  const uchar *i = (const uchar*)*image->data();
  XcursorPixel *o = cursor->pixels;
  for (int y = 0;y < image->h();y++) {
    for (int x = 0;x < image->w();x++) {
      switch (image->d()) {
      case 1:
        *o = (0xff<<24) | (i[0]<<16) | (i[0]<<8) | i[0];
        break;
      case 2:
        *o = (i[1]<<24) | (i[0]<<16) | (i[0]<<8) | i[0];
        break;
      case 3:
        *o = (0xff<<24) | (i[0]<<16) | (i[1]<<8) | i[2];
        break;
      case 4:
        *o = (i[3]<<24) | (i[0]<<16) | (i[1]<<8) | i[2];
        break;
      }
      i += image->d();
      o++;
    }
    i += extra_data;
  }

  cursor->xhot = hotx;
  cursor->yhot = hoty;

  xc = XcursorImageLoadCursor(fl_display, cursor);
  XDefineCursor(fl_display, xid, xc);
  XFreeCursor(fl_display, xc);

  XcursorImageDestroy(cursor);

  return 1;
#endif
}